

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

sexp_conflict
sexp_getpwnam_r_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg2)

{
  int iVar1;
  passwd *__resultbuf;
  passwd **__result;
  sexp_conflict psVar2;
  sexp_conflict res;
  sexp_conflict res1;
  sexp_conflict res4;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict local_80;
  sexp_conflict local_78;
  sexp_conflict local_70;
  sexp_gc_var_t local_68;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_80 = (sexp_conflict)0x43e;
  local_68.var = (sexp_conflict *)0x0;
  local_68.next = (sexp_gc_var_t *)0x0;
  local_78 = (sexp_conflict)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  local_70 = (sexp_conflict)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  psVar2 = arg0;
  if ((((((ulong)arg0 & 3) == 0) && (arg0->tag == 9)) && (psVar2 = arg2, ((ulong)arg2 & 3) == 0)) &&
     (arg2->tag == 9)) {
    local_68.var = &local_80;
    local_48.next = &local_68;
    local_68.next = (ctx->value).context.saves;
    (ctx->value).context.saves = local_48.next;
    local_48.var = &local_78;
    local_58.next = &local_48;
    (ctx->value).context.saves = local_58.next;
    local_58.var = &local_70;
    (ctx->value).context.saves = &local_58;
    __resultbuf = (passwd *)calloc(1,0x31);
    __result = (passwd **)calloc(1,9);
    iVar1 = getpwnam_r((((arg0->value).type.cpl)->value).flonum_bits +
                       (long)(((arg0->value).type.name)->value).flonum_bits,__resultbuf,
                       (((arg2->value).type.name)->value).flonum_bits + 8 +
                       (long)(arg2->value).type.cpl,(arg2->value).string.length,__result);
    if (iVar1 == 0) {
      local_78 = (sexp_conflict)
                 sexp_make_cpointer(ctx,(long)(self->value).type.print >> 1,__resultbuf,arg2,1);
      local_70 = (sexp_conflict)
                 sexp_make_cpointer(ctx,(((self->value).type.finalize_name)->value).uvector.length
                                        >> 1,__result,0x3e,1);
      local_80 = (sexp_conflict)0x23e;
      sexp_push_op(ctx,&local_80,local_70);
      sexp_push_op(ctx,&local_80,local_78);
    }
    else {
      local_80 = (sexp_conflict)0x3e;
    }
    (ctx->value).context.saves = local_68.next;
    return local_80;
  }
  psVar2 = (sexp_conflict)sexp_type_exception(ctx,self,9,psVar2);
  return psVar2;
}

Assistant:

sexp sexp_getpwnam_r_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg2) {
  int err = 0;
  struct passwd* tmp1;
  struct passwd* *tmp4;
  sexp_gc_var3(res, res1, res4);
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_stringp(arg2))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg2);
  sexp_gc_preserve3(ctx, res, res1, res4);
  tmp1 = (struct passwd*) calloc(1, 1 + sizeof(tmp1[0]));
  tmp4 = (struct passwd**) calloc(1, 1 + sizeof(tmp4[0]));
  err = getpwnam_r(sexp_string_data(arg0), tmp1, sexp_string_data(arg2), sexp_string_size(arg2), tmp4);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, arg2, 1);
  res4 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_ONE)), tmp4, SEXP_FALSE, 1);
  res = SEXP_NULL;
  sexp_push(ctx, res, res4);
  sexp_push(ctx, res, res1);
  }
  sexp_gc_release3(ctx);
  return res;
}